

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O0

array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *info)

{
  split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *psVar1;
  size_type __pos;
  reference pvVar2;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_50;
  undefined1 local_29;
  size_type local_28;
  size_t pos;
  split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *info_local;
  b_str<char32_t> *str_local;
  array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
  *re;
  
  pos = (size_t)info;
  info_local = (split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *)str;
  str_local = __return_storage_ptr__->_M_elems;
  local_28 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             find_first_of(str,info->delim,0);
  if (local_28 == 0xffffffffffffffff) {
    std::__cxx11::u32string::u32string
              ((u32string *)__return_storage_ptr__,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               info_local);
    std::__cxx11::u32string::u32string((u32string *)(__return_storage_ptr__->_M_elems + 1));
  }
  else {
    local_29 = 0;
    std::
    array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
    ::array(__return_storage_ptr__);
    psVar1 = info_local;
    __pos = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            find_first_not_of((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                               *)info_local,*(char32_t *)pos,local_28);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(&local_50,
           (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)psVar1,
           __pos,0xffffffffffffffff);
    pvVar2 = std::
             array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
             ::operator[](__return_storage_ptr__,1);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(pvVar2,&local_50);
    std::__cxx11::u32string::~u32string((u32string *)&local_50);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
          info_local,local_28,0xffffffffffffffff);
    psVar1 = info_local;
    pvVar2 = std::
             array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
             ::operator[](__return_storage_ptr__,0);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(pvVar2,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}